

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::stability(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  type_conflict5 tVar1;
  int iVar2;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff48;
  cpp_dec_float<200U,_int,_void> *i;
  undefined4 local_98;
  undefined4 local_94 [5];
  undefined8 local_80;
  undefined4 *local_78;
  undefined8 local_68;
  undefined4 *local_60;
  undefined4 *local_50;
  undefined4 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  uint *local_38;
  uint *local_30;
  uint *local_18;
  uint *local_10;
  
  i = in_RDI;
  iVar2 = (**(code **)(*(long *)(in_RSI->data)._M_elems + 8))();
  if (iVar2 == 0) {
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffff48,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6cdcdd);
    if (tVar1) {
      local_98 = 1;
      local_60 = &local_98;
      local_68 = 0;
      local_50 = local_60;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (in_RSI,(longlong)i,in_RDI);
    }
    else {
      local_30 = (in_RSI->data)._M_elems + 7;
      local_38 = in_RSI[1].data._M_elems + 7;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_30,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_38);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
      local_10 = local_30;
      local_18 = local_38;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_RDI,in_stack_ffffffffffffff48,(cpp_dec_float<200U,_int,_void> *)0x6cdde2);
    }
  }
  else {
    local_94[0] = 0;
    local_78 = local_94;
    local_80 = 0;
    local_48 = local_78;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (in_RSI,(longlong)i,in_RDI);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)i;
}

Assistant:

R SLUFactor<R>::stability() const
{
   if(status() != this->OK)
      return 0;

   if(this->maxabs < this->initMaxabs)
      return 1;

   assert(this->maxabs != 0.0);
   return this->initMaxabs / this->maxabs;
}